

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_shader_buffer_load(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_shader_buffer_load != 0) {
    glad_glMakeBufferResidentNV = (PFNGLMAKEBUFFERRESIDENTNVPROC)(*load)("glMakeBufferResidentNV");
    glad_glMakeBufferNonResidentNV =
         (PFNGLMAKEBUFFERNONRESIDENTNVPROC)(*load)("glMakeBufferNonResidentNV");
    glad_glIsBufferResidentNV = (PFNGLISBUFFERRESIDENTNVPROC)(*load)("glIsBufferResidentNV");
    glad_glMakeNamedBufferResidentNV =
         (PFNGLMAKENAMEDBUFFERRESIDENTNVPROC)(*load)("glMakeNamedBufferResidentNV");
    glad_glMakeNamedBufferNonResidentNV =
         (PFNGLMAKENAMEDBUFFERNONRESIDENTNVPROC)(*load)("glMakeNamedBufferNonResidentNV");
    glad_glIsNamedBufferResidentNV =
         (PFNGLISNAMEDBUFFERRESIDENTNVPROC)(*load)("glIsNamedBufferResidentNV");
    glad_glGetBufferParameterui64vNV =
         (PFNGLGETBUFFERPARAMETERUI64VNVPROC)(*load)("glGetBufferParameterui64vNV");
    glad_glGetNamedBufferParameterui64vNV =
         (PFNGLGETNAMEDBUFFERPARAMETERUI64VNVPROC)(*load)("glGetNamedBufferParameterui64vNV");
    glad_glGetIntegerui64vNV = (PFNGLGETINTEGERUI64VNVPROC)(*load)("glGetIntegerui64vNV");
    glad_glUniformui64NV = (PFNGLUNIFORMUI64NVPROC)(*load)("glUniformui64NV");
    glad_glUniformui64vNV = (PFNGLUNIFORMUI64VNVPROC)(*load)("glUniformui64vNV");
    glad_glGetUniformui64vNV = (PFNGLGETUNIFORMUI64VNVPROC)(*load)("glGetUniformui64vNV");
    glad_glProgramUniformui64NV = (PFNGLPROGRAMUNIFORMUI64NVPROC)(*load)("glProgramUniformui64NV");
    glad_glProgramUniformui64vNV =
         (PFNGLPROGRAMUNIFORMUI64VNVPROC)(*load)("glProgramUniformui64vNV");
  }
  return;
}

Assistant:

static void load_GL_NV_shader_buffer_load(GLADloadproc load) {
	if(!GLAD_GL_NV_shader_buffer_load) return;
	glad_glMakeBufferResidentNV = (PFNGLMAKEBUFFERRESIDENTNVPROC)load("glMakeBufferResidentNV");
	glad_glMakeBufferNonResidentNV = (PFNGLMAKEBUFFERNONRESIDENTNVPROC)load("glMakeBufferNonResidentNV");
	glad_glIsBufferResidentNV = (PFNGLISBUFFERRESIDENTNVPROC)load("glIsBufferResidentNV");
	glad_glMakeNamedBufferResidentNV = (PFNGLMAKENAMEDBUFFERRESIDENTNVPROC)load("glMakeNamedBufferResidentNV");
	glad_glMakeNamedBufferNonResidentNV = (PFNGLMAKENAMEDBUFFERNONRESIDENTNVPROC)load("glMakeNamedBufferNonResidentNV");
	glad_glIsNamedBufferResidentNV = (PFNGLISNAMEDBUFFERRESIDENTNVPROC)load("glIsNamedBufferResidentNV");
	glad_glGetBufferParameterui64vNV = (PFNGLGETBUFFERPARAMETERUI64VNVPROC)load("glGetBufferParameterui64vNV");
	glad_glGetNamedBufferParameterui64vNV = (PFNGLGETNAMEDBUFFERPARAMETERUI64VNVPROC)load("glGetNamedBufferParameterui64vNV");
	glad_glGetIntegerui64vNV = (PFNGLGETINTEGERUI64VNVPROC)load("glGetIntegerui64vNV");
	glad_glUniformui64NV = (PFNGLUNIFORMUI64NVPROC)load("glUniformui64NV");
	glad_glUniformui64vNV = (PFNGLUNIFORMUI64VNVPROC)load("glUniformui64vNV");
	glad_glGetUniformui64vNV = (PFNGLGETUNIFORMUI64VNVPROC)load("glGetUniformui64vNV");
	glad_glProgramUniformui64NV = (PFNGLPROGRAMUNIFORMUI64NVPROC)load("glProgramUniformui64NV");
	glad_glProgramUniformui64vNV = (PFNGLPROGRAMUNIFORMUI64VNVPROC)load("glProgramUniformui64vNV");
}